

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

uint openjtalk_getHTSVoiceCount(OpenJTalk *oj,HtsVoiceFilelist *list)

{
  uint uVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (list != (HtsVoiceFilelist *)0x0) {
    uVar1 = 0;
    do {
      uVar1 = uVar1 + 1;
      list = list->succ;
    } while (list != (HtsVoiceFilelist_tag *)0x0);
    return uVar1;
  }
  return 0;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_getHTSVoiceCount(OpenJTalk *oj, HtsVoiceFilelist *list)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return 0;
	}

	unsigned int counter = 0;
	while (list)
	{
		counter++;
		list = list->succ;
	}

	return counter;
}